

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

bool __thiscall
HighsLpRelaxation::computeDualProof
          (HighsLpRelaxation *this,HighsDomain *globaldomain,double upperbound,
          vector<int,_std::allocator<int>_> *inds,vector<double,_std::allocator<double>_> *vals,
          double *rhs,bool extractCliques)

{
  double dVar1;
  bool bVar2;
  HighsVarType HVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  pointer pHVar7;
  HighsSolution *pHVar8;
  int *piVar9;
  double *pdVar10;
  size_type sVar11;
  vector<int,_std::allocator<int>_> *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R8;
  byte in_R9B;
  double in_XMM0_Qa;
  double dVar12;
  bool removeValue;
  double val;
  HighsInt j;
  HighsCDouble sum;
  HighsInt end;
  HighsInt start;
  HighsInt i_1;
  HighsInt i;
  HighsCDouble upper;
  HighsLp *lp;
  vector<double,_std::allocator<double>_> row_dual;
  double in_stack_00000338;
  HighsInt in_stack_00000344;
  double *in_stack_00000348;
  HighsInt *in_stack_00000350;
  HighsMipSolver *in_stack_00000358;
  HighsCliqueTable *in_stack_00000360;
  undefined4 in_stack_fffffffffffffe58;
  HighsInt in_stack_fffffffffffffe5c;
  HighsMipSolver *in_stack_fffffffffffffe60;
  value_type_conflict1 *in_stack_fffffffffffffe68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe88;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  HighsSolution *in_stack_fffffffffffffef0;
  HighsInt in_stack_fffffffffffffefc;
  double *in_stack_ffffffffffffff00;
  HighsInt *in_stack_ffffffffffffff08;
  HighsDomain *in_stack_ffffffffffffff10;
  HighsDomain *pHVar13;
  value_type local_a4;
  HighsCDouble local_a0;
  value_type local_90;
  value_type local_8c;
  int local_88;
  int local_84;
  HighsCDouble local_80 [2];
  HighsLp *local_60;
  vector<double,_std::allocator<double>_> local_58;
  byte local_39;
  double *local_38;
  vector<int,_std::allocator<int>_> *local_28;
  double local_20;
  long local_18;
  byte local_1;
  
  local_39 = in_R9B & 1;
  local_38 = in_R8;
  local_28 = in_RDX;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  Highs::getSolution((Highs *)(in_RDI + 1));
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  local_60 = Highs::getLp((Highs *)(in_RDI + 1));
  HighsCDouble::HighsCDouble(local_80,local_20);
  for (local_84 = 0; local_84 != local_60->num_row_; local_84 = local_84 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_84);
    if (*pvVar4 <= 0.0) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_84);
      if (*pvVar4 <= 0.0 && *pvVar4 != 0.0) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_60->row_upper_,(long)local_84);
        if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
          std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_84);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&local_60->row_upper_,(long)local_84);
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe60,
                     (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
        }
        else {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_58,(long)local_84);
          *pvVar4 = 0.0;
        }
      }
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_60->row_lower_,(long)local_84);
      if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
        std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_84);
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&local_60->row_lower_,(long)local_84);
        HighsCDouble::operator-=
                  ((HighsCDouble *)in_stack_fffffffffffffe60,
                   (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
      else {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_84);
        *pvVar4 = 0.0;
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x606e6a);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x606e77);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::vector<double,_std::allocator<double>_>::reserve
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_88 = 0;
  do {
    if (local_88 == local_60->num_col_) {
      dVar12 = HighsCDouble::operator_cast_to_double(local_80);
      *local_38 = dVar12;
      std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x6074be);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x6074d0);
      std::vector<int,_std::allocator<int>_>::size(local_28);
      HighsDomain::tightenCoefficients
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffefc,(double *)in_stack_fffffffffffffef0);
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x607519);
      piVar9 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x607531);
      pdVar10 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x607543);
      sVar11 = std::vector<int,_std::allocator<int>_>::size(local_28);
      HighsDebugSol::checkCut
                ((HighsDebugSol *)&pHVar7->field_0x68b0,piVar9,pdVar10,(HighsInt)sVar11,*local_38);
      if ((local_39 & 1) != 0) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x60759e);
        in_stack_fffffffffffffe70 =
             (vector<double,_std::allocator<double>_> *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x6075ca);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x6075dc);
        std::vector<int,_std::allocator<int>_>::size(local_28);
        HighsCliqueTable::extractCliquesFromCut
                  (in_stack_00000360,in_stack_00000358,in_stack_00000350,in_stack_00000348,
                   in_stack_00000344,in_stack_00000338);
      }
      local_1 = 1;
LAB_0060762d:
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe70);
      return (bool)(local_1 & 1);
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(local_60->a_matrix_).start_,(long)local_88);
    local_8c = *pvVar6;
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&(local_60->a_matrix_).start_,(long)(local_88 + 1));
    local_90 = *pvVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_60->col_cost_,(long)local_88);
    HighsCDouble::HighsCDouble(&local_a0,*pvVar5);
    for (local_a4 = local_8c; local_a4 != local_90; local_a4 = local_a4 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&(local_60->a_matrix_).index_,(long)local_a4);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)*pvVar6);
      if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(local_60->a_matrix_).value_,(long)local_a4);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_60->a_matrix_).index_,(long)local_a4);
        std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)*pvVar6);
        HighsCDouble::operator-=
                  ((HighsCDouble *)in_stack_fffffffffffffe60,
                   (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
      }
    }
    in_stack_ffffffffffffff10 = (HighsDomain *)HighsCDouble::operator_cast_to_double(&local_a0);
    if (*(double *)(*(long *)(*in_RDI + 8) + 0x108) < ABS((double)in_stack_ffffffffffffff10)) {
      in_stack_ffffffffffffff08 =
           (HighsInt *)((ulong)in_stack_ffffffffffffff10 & 0x7fffffffffffffff);
      pHVar13 = in_stack_ffffffffffffff10;
      pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6070cb);
      bVar2 = (double)in_stack_ffffffffffffff08 <= pHVar7->feastol;
      if (!bVar2) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x308),
                            (long)local_88);
        in_stack_ffffffffffffff00 = (double *)*pvVar5;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 800),
                            (long)local_88);
        if (((double)in_stack_ffffffffffffff00 != *pvVar5) ||
           (NAN((double)in_stack_ffffffffffffff00) || NAN(*pvVar5))) {
          HVar3 = HighsMipSolver::variableType(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
          in_stack_fffffffffffffefc = CONCAT13(HVar3,(int3)in_stack_fffffffffffffefc);
          if (HVar3 != kContinuous) goto LAB_006072ee;
        }
        if ((double)in_stack_ffffffffffffff10 <= 0.0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 800),
                              (long)local_88);
          dVar12 = *pvVar5;
          pHVar8 = Highs::getSolution((Highs *)(in_RDI + 1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar8->col_value,(long)local_88);
          dVar1 = *pvVar5;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x6072ce);
          bVar2 = dVar12 - dVar1 <= pHVar7->feastol;
        }
        else {
          in_stack_fffffffffffffef0 = Highs::getSolution((Highs *)(in_RDI + 1));
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_stack_fffffffffffffef0->col_value,(long)local_88);
          dVar12 = *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x308),
                              (long)local_88);
          dVar1 = *pvVar5;
          pHVar7 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                   operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                               *)0x607224);
          bVar2 = dVar12 - dVar1 <= pHVar7->feastol;
        }
      }
LAB_006072ee:
      if (bVar2) {
        if (0.0 <= (double)in_stack_ffffffffffffff10) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x308),
                              (long)local_88);
          if ((*pvVar5 == -INFINITY) && (!NAN(*pvVar5))) {
            local_1 = 0;
            goto LAB_0060762d;
          }
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(local_18 + 0x308),(long)local_88);
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe60,
                     (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          in_stack_ffffffffffffff10 = pHVar13;
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 800),
                              (long)local_88);
          if ((*pvVar5 == INFINITY) && (!NAN(*pvVar5))) {
            local_1 = 0;
            goto LAB_0060762d;
          }
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(local_18 + 800),(long)local_88);
          HighsCDouble::operator-=
                    ((HighsCDouble *)in_stack_fffffffffffffe60,
                     (double)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
          in_stack_ffffffffffffff10 = pHVar13;
        }
      }
      else {
        std::vector<double,_std::allocator<double>_>::push_back
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
                   (value_type_conflict2 *)in_stack_fffffffffffffe68);
        in_stack_ffffffffffffff10 = pHVar13;
      }
    }
    local_88 = local_88 + 1;
  } while( true );
}

Assistant:

bool HighsLpRelaxation::computeDualProof(const HighsDomain& globaldomain,
                                         double upperbound,
                                         std::vector<HighsInt>& inds,
                                         std::vector<double>& vals, double& rhs,
                                         bool extractCliques) const {
#if 0
  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();
  HighsCDouble proofRhs = upperbound;
  assert(lpsolver.getInfo().max_dual_infeasibility <=
         mipsolver.mipdata_->feastol);

  proofRhs -= lpsolver.getInfo().objective_function_value;
  inds.clear();
  vals.clear();
  double maxVal = 0.0;
  double maxValGlb = 0.0;
  double sumLocal = 0.0;
  HighsInt numLocalCols = 0;
  const HighsInt numCol = lpsolver.getNumCol();
  for (HighsInt i : mipsolver.mipdata_->integral_cols) {
    if (basis.col_status[i] == HighsBasisStatus::kBasic) continue;

    if (sol.col_dual[i] > kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_lower_[i]) {
        maxVal = std::max(sol.col_dual[i], maxVal);
        sumLocal += sol.col_dual[i];
        ++numLocalCols;
      }
    } else if (sol.col_dual[i] < -kHighsTiny) {
      if (sol.col_value[i] != globaldomain.col_upper_[i]) {
        maxVal = std::max(-sol.col_dual[i], maxVal);
        sumLocal += -sol.col_dual[i];
        ++numLocalCols;
      }
    } else
      continue;

    proofRhs += sol.col_value[i] * sol.col_dual[i];

    vals.push_back(sol.col_dual[i]);
    inds.push_back(i);
  }

  int expShift;
  std::frexp(maxVal - mipsolver.mipdata_->epsilon, &expShift);
  expShift = -expShift;

  HighsInt len = vals.size();

  double minGlbVal = numLocalCols == 0
                         ? 0.0
                         : std::ldexp(sumLocal / numLocalCols, expShift) -
                               mipsolver.mipdata_->feastol;

  for (HighsInt i = len - 1; i >= 0; --i) {
    HighsInt iCol = inds[i];
    double val = std::ldexp(vals[i], expShift);

    bool remove = false;

    double absVal = std::fabs(val);
    if (absVal <= mipsolver.mipdata_->feastol || globaldomain.isFixed(iCol)) {
      if (vals[i] > 0) {
        if (globaldomain.col_lower_[iCol] == -kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_lower_[iCol];
      } else {
        if (globaldomain.col_upper_[iCol] == kHighsInf) return false;
        proofRhs -= vals[i] * globaldomain.col_upper_[iCol];
      }

      remove = true;
    } else if (absVal < minGlbVal) {
      if (vals[i] > 0)
        remove = sol.col_value[iCol] == globaldomain.col_lower_[iCol];
      else
        remove = sol.col_value[iCol] == globaldomain.col_upper_[iCol];

      if (remove) proofRhs -= vals[i] * sol.col_value[iCol];
    }

    if (remove) {
      --len;
      vals[i] = vals[len];
      inds[i] = inds[len];
    } else {
      vals[i] = val;
    }
  }

  vals.resize(len);
  inds.resize(len);

  rhs = std::ldexp(double(proofRhs), expShift);

  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#else
  std::vector<double> row_dual = lpsolver.getSolution().row_dual;

  const HighsLp& lp = lpsolver.getLp();

  assert(std::isfinite(upperbound));
  HighsCDouble upper = upperbound;

  for (HighsInt i = 0; i != lp.num_row_; ++i) {
    // @FlipRowDual row_dual[i] < 0 became row_dual[i] > 0
    if (row_dual[i] > 0) {
      if (lp.row_lower_[i] != -kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_lower_[i];
      else
        row_dual[i] = 0;
      // @FlipRowDual row_dual[i] > 0 became row_dual[i] < 0
    } else if (row_dual[i] < 0) {
      if (lp.row_upper_[i] != kHighsInf)
        // @FlipRowDual += became -=
        upper -= row_dual[i] * lp.row_upper_[i];
      else
        row_dual[i] = 0;
    }
  }

  inds.clear();
  vals.clear();
  inds.reserve(lp.num_col_);
  vals.reserve(lp.num_col_);
  for (HighsInt i = 0; i != lp.num_col_; ++i) {
    HighsInt start = lp.a_matrix_.start_[i];
    HighsInt end = lp.a_matrix_.start_[i + 1];

    HighsCDouble sum = lp.col_cost_[i];

    for (HighsInt j = start; j != end; ++j) {
      if (row_dual[lp.a_matrix_.index_[j]] == 0) continue;
      // @FlipRowDual += became -=
      sum -= lp.a_matrix_.value_[j] * row_dual[lp.a_matrix_.index_[j]];
    }

    double val = double(sum);

    if (std::fabs(val) <= mipsolver.options_mip_->small_matrix_value) continue;

    bool removeValue = std::fabs(val) <= mipsolver.mipdata_->feastol;

    if (!removeValue &&
        (globaldomain.col_lower_[i] == globaldomain.col_upper_[i] ||
         mipsolver.variableType(i) == HighsVarType::kContinuous)) {
      if (val > 0)
        removeValue =
            lpsolver.getSolution().col_value[i] - globaldomain.col_lower_[i] <=
            mipsolver.mipdata_->feastol;
      else
        removeValue =
            globaldomain.col_upper_[i] - lpsolver.getSolution().col_value[i] <=
            mipsolver.mipdata_->feastol;
    }

    if (removeValue) {
      if (val < 0) {
        if (globaldomain.col_upper_[i] == kHighsInf) return false;
        upper -= val * globaldomain.col_upper_[i];
      } else {
        if (globaldomain.col_lower_[i] == -kHighsInf) return false;

        upper -= val * globaldomain.col_lower_[i];
      }

      continue;
    }

    vals.push_back(val);
    inds.push_back(i);
  }

  rhs = double(upper);
  assert(std::isfinite(rhs));
  globaldomain.tightenCoefficients(inds.data(), vals.data(), inds.size(), rhs);

  mipsolver.mipdata_->debugSolution.checkCut(inds.data(), vals.data(),
                                             inds.size(), rhs);
  if (extractCliques)
    mipsolver.mipdata_->cliquetable.extractCliquesFromCut(
        mipsolver, inds.data(), vals.data(), inds.size(), rhs);

  return true;
#endif
}